

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.h
# Opt level: O0

bool __thiscall snestistics::DmaTransfer::operator<(DmaTransfer *this,DmaTransfer *o)

{
  DmaTransfer *o_local;
  DmaTransfer *this_local;
  
  if (this->pc == o->pc) {
    if (this->channel == o->channel) {
      if (this->a_address == o->a_address) {
        if (this->transfer_bytes == o->transfer_bytes) {
          if (this->transfer_mode == o->transfer_mode) {
            if (this->a_bank == o->a_bank) {
              if (this->flags == o->flags) {
                if (this->wram == o->wram) {
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = this->wram < o->wram;
                }
              }
              else {
                this_local._7_1_ = this->flags < o->flags;
              }
            }
            else {
              this_local._7_1_ = this->a_bank < o->a_bank;
            }
          }
          else {
            this_local._7_1_ = this->transfer_mode < o->transfer_mode;
          }
        }
        else {
          this_local._7_1_ = this->transfer_bytes < o->transfer_bytes;
        }
      }
      else {
        this_local._7_1_ = this->a_address < o->a_address;
      }
    }
    else {
      this_local._7_1_ = this->channel < o->channel;
    }
  }
  else {
    this_local._7_1_ = this->pc < o->pc;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const DmaTransfer &o) const {
		if (pc != o.pc) return pc<o.pc;
		if (channel != o.channel) return channel<o.channel;
		if (a_address != o.a_address) return a_address<o.a_address;
		if (transfer_bytes != o.transfer_bytes) return transfer_bytes<o.transfer_bytes;
		if (transfer_mode != o.transfer_mode) return transfer_mode<o.transfer_mode;
		if (a_bank != o.a_bank) return a_bank<o.a_bank;
		if (flags != o.flags) return flags < o.flags;
		if (wram != o.wram) return wram < o.wram;
		return false;
	}